

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O0

int __thiscall btSoftBody::generateBendingConstraints(btSoftBody *this,int distance,Material *mat)

{
  Node *pNVar1;
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  Link *pLVar9;
  Node *pNVar10;
  btAlignedObjectArray<int> *pbVar11;
  int *piVar12;
  int in_ESI;
  long in_RDI;
  int nlinks;
  uint sum_1;
  int k_1;
  uint sum;
  int j_1;
  int kk;
  int k;
  int jj;
  int i_1;
  int ii;
  int ib_1;
  int ia_1;
  btAlignedObjectArray<NodeLinks> nodeLinks;
  int ib;
  int ia;
  uint *adj;
  uint inf;
  int n;
  int j;
  int i;
  btAlignedObjectArray<NodeLinks> *in_stack_fffffffffffffe30;
  btAlignedObjectArray<btSoftBody::Link> *in_stack_fffffffffffffe38;
  btAlignedObjectArray<int> *in_stack_fffffffffffffe40;
  btAlignedObjectArray<int> *in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe50;
  int in_stack_fffffffffffffe54;
  int local_c8;
  int local_c0;
  int local_b4;
  int local_ac;
  int local_a4;
  btAlignedObjectArray<NodeLinks> local_60;
  int local_40;
  int local_3c;
  void *local_38;
  undefined4 local_30;
  int local_2c;
  int local_28;
  int local_24;
  int local_14;
  int local_4;
  
  if (in_ESI < 2) {
    local_4 = 0;
  }
  else {
    local_14 = in_ESI;
    local_2c = btAlignedObjectArray<btSoftBody::Node>::size
                         ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370));
    local_30 = 0x7fffffff;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)(local_2c * local_2c);
    uVar8 = SUB168(auVar2 * ZEXT816(4),0);
    if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
      uVar8 = 0xffffffffffffffff;
    }
    local_38 = operator_new__(uVar8);
    for (local_28 = 0; local_28 < local_2c; local_28 = local_28 + 1) {
      for (local_24 = 0; local_24 < local_2c; local_24 = local_24 + 1) {
        if (local_24 == local_28) {
          *(undefined4 *)((long)local_38 + (long)(local_24 * local_2c + local_28) * 4) = 0;
          *(undefined4 *)((long)local_38 + (long)(local_28 * local_2c + local_24) * 4) = 0;
        }
        else {
          *(undefined4 *)((long)local_38 + (long)(local_24 * local_2c + local_28) * 4) = 0x7fffffff;
          *(undefined4 *)((long)local_38 + (long)(local_28 * local_2c + local_24) * 4) = 0x7fffffff;
        }
      }
    }
    for (local_24 = 0; iVar4 = local_24,
        iVar3 = btAlignedObjectArray<btSoftBody::Link>::size
                          ((btAlignedObjectArray<btSoftBody::Link> *)(in_RDI + 0x390)),
        iVar4 < iVar3; local_24 = local_24 + 1) {
      pLVar9 = btAlignedObjectArray<btSoftBody::Link>::operator[]
                         ((btAlignedObjectArray<btSoftBody::Link> *)(in_RDI + 0x390),local_24);
      pNVar1 = pLVar9->m_n[0];
      pNVar10 = btAlignedObjectArray<btSoftBody::Node>::operator[]
                          ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370),0);
      local_3c = (int)(((long)pNVar1 - (long)pNVar10) / 0x78);
      pLVar9 = btAlignedObjectArray<btSoftBody::Link>::operator[]
                         ((btAlignedObjectArray<btSoftBody::Link> *)(in_RDI + 0x390),local_24);
      pNVar1 = pLVar9->m_n[1];
      pNVar10 = btAlignedObjectArray<btSoftBody::Node>::operator[]
                          ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370),0);
      local_40 = (int)(((long)pNVar1 - (long)pNVar10) / 0x78);
      *(undefined4 *)((long)local_38 + (long)(local_40 * local_2c + local_3c) * 4) = 1;
      *(undefined4 *)((long)local_38 + (long)(local_3c * local_2c + local_40) * 4) = 1;
    }
    if (local_14 == 2) {
      btAlignedObjectArray<NodeLinks>::btAlignedObjectArray(in_stack_fffffffffffffe30);
      btAlignedObjectArray<btSoftBody::Node>::size
                ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370));
      NodeLinks::NodeLinks((NodeLinks *)0x26ee30);
      btAlignedObjectArray<NodeLinks>::resize
                ((btAlignedObjectArray<NodeLinks> *)
                 CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                 (int)((ulong)in_stack_fffffffffffffe48 >> 0x20),
                 (NodeLinks *)in_stack_fffffffffffffe40);
      NodeLinks::~NodeLinks((NodeLinks *)0x26ee5d);
      for (local_24 = 0; iVar4 = local_24,
          iVar3 = btAlignedObjectArray<btSoftBody::Link>::size
                            ((btAlignedObjectArray<btSoftBody::Link> *)(in_RDI + 0x390)),
          iVar4 < iVar3; local_24 = local_24 + 1) {
        pLVar9 = btAlignedObjectArray<btSoftBody::Link>::operator[]
                           ((btAlignedObjectArray<btSoftBody::Link> *)(in_RDI + 0x390),local_24);
        pNVar1 = pLVar9->m_n[0];
        pNVar10 = btAlignedObjectArray<btSoftBody::Node>::operator[]
                            ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370),0);
        iVar4 = (int)((ulong)((long)pNVar1 - (long)pNVar10) >> 3) * -0x11111111;
        pLVar9 = btAlignedObjectArray<btSoftBody::Link>::operator[]
                           ((btAlignedObjectArray<btSoftBody::Link> *)(in_RDI + 0x390),local_24);
        pNVar1 = pLVar9->m_n[1];
        pNVar10 = btAlignedObjectArray<btSoftBody::Node>::operator[]
                            ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370),0);
        iVar3 = (int)((ulong)((long)pNVar1 - (long)pNVar10) >> 3) * -0x11111111;
        btAlignedObjectArray<NodeLinks>::operator[](&local_60,iVar4);
        iVar5 = btAlignedObjectArray<int>::findLinearSearch
                          (in_stack_fffffffffffffe40,(int *)in_stack_fffffffffffffe38);
        pbVar11 = &btAlignedObjectArray<NodeLinks>::operator[](&local_60,iVar4)->m_links;
        iVar6 = btAlignedObjectArray<int>::size(pbVar11);
        if (iVar5 == iVar6) {
          btAlignedObjectArray<NodeLinks>::operator[](&local_60,iVar4);
          btAlignedObjectArray<int>::push_back
                    (in_stack_fffffffffffffe40,(int *)in_stack_fffffffffffffe38);
        }
        btAlignedObjectArray<NodeLinks>::operator[](&local_60,iVar3);
        iVar4 = btAlignedObjectArray<int>::findLinearSearch
                          (in_stack_fffffffffffffe40,(int *)in_stack_fffffffffffffe38);
        pbVar11 = &btAlignedObjectArray<NodeLinks>::operator[](&local_60,iVar3)->m_links;
        iVar5 = btAlignedObjectArray<int>::size(pbVar11);
        if (iVar4 == iVar5) {
          btAlignedObjectArray<NodeLinks>::operator[](&local_60,iVar3);
          btAlignedObjectArray<int>::push_back
                    (in_stack_fffffffffffffe40,(int *)in_stack_fffffffffffffe38);
        }
      }
      for (local_a4 = 0; iVar4 = btAlignedObjectArray<NodeLinks>::size(&local_60), local_a4 < iVar4;
          local_a4 = local_a4 + 1) {
        local_ac = 0;
        while( true ) {
          pbVar11 = &btAlignedObjectArray<NodeLinks>::operator[](&local_60,local_a4)->m_links;
          iVar4 = btAlignedObjectArray<int>::size(pbVar11);
          if (iVar4 <= local_ac) break;
          pbVar11 = &btAlignedObjectArray<NodeLinks>::operator[](&local_60,local_a4)->m_links;
          piVar12 = btAlignedObjectArray<int>::operator[](pbVar11,local_ac);
          iVar4 = *piVar12;
          local_b4 = 0;
          while( true ) {
            in_stack_fffffffffffffe54 = local_b4;
            pbVar11 = &btAlignedObjectArray<NodeLinks>::operator[](&local_60,iVar4)->m_links;
            in_stack_fffffffffffffe50 = btAlignedObjectArray<int>::size(pbVar11);
            if (in_stack_fffffffffffffe50 <= in_stack_fffffffffffffe54) break;
            in_stack_fffffffffffffe48 =
                 &btAlignedObjectArray<NodeLinks>::operator[](&local_60,iVar4)->m_links;
            in_stack_fffffffffffffe40 =
                 (btAlignedObjectArray<int> *)
                 btAlignedObjectArray<int>::operator[](in_stack_fffffffffffffe48,local_b4);
            iVar3 = *(int *)in_stack_fffffffffffffe40;
            if ((local_a4 != iVar3) &&
               (uVar7 = *(int *)((long)local_38 + (long)(iVar4 * local_2c + local_a4) * 4) +
                        *(int *)((long)local_38 + (long)(iVar3 * local_2c + iVar4) * 4),
               uVar7 < *(uint *)((long)local_38 + (long)(iVar3 * local_2c + local_a4) * 4))) {
              *(uint *)((long)local_38 + (long)(local_a4 * local_2c + iVar3) * 4) = uVar7;
              *(uint *)((long)local_38 + (long)(iVar3 * local_2c + local_a4) * 4) = uVar7;
            }
            local_b4 = local_b4 + 1;
          }
          local_ac = local_ac + 1;
        }
      }
      btAlignedObjectArray<NodeLinks>::~btAlignedObjectArray
                ((btAlignedObjectArray<NodeLinks> *)0x26f3f5);
    }
    else {
      for (local_c0 = 0; local_c0 < local_2c; local_c0 = local_c0 + 1) {
        for (local_28 = 0; iVar4 = local_28, local_28 < local_2c; local_28 = local_28 + 1) {
          while (local_24 = iVar4 + 1, local_24 < local_2c) {
            uVar7 = *(int *)((long)local_38 + (long)(local_c0 * local_2c + local_24) * 4) +
                    *(int *)((long)local_38 + (long)(local_28 * local_2c + local_c0) * 4);
            iVar4 = local_24;
            if (uVar7 < *(uint *)((long)local_38 + (long)(local_28 * local_2c + local_24) * 4)) {
              *(uint *)((long)local_38 + (long)(local_24 * local_2c + local_28) * 4) = uVar7;
              *(uint *)((long)local_38 + (long)(local_28 * local_2c + local_24) * 4) = uVar7;
            }
          }
        }
      }
    }
    local_c8 = 0;
    for (local_28 = 0; iVar4 = local_28, local_28 < local_2c; local_28 = local_28 + 1) {
      while (local_24 = iVar4 + 1, local_24 < local_2c) {
        iVar4 = local_24;
        if (*(int *)((long)local_38 + (long)(local_28 * local_2c + local_24) * 4) == local_14) {
          appendLink((btSoftBody *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                     (int)((ulong)in_stack_fffffffffffffe48 >> 0x20),(int)in_stack_fffffffffffffe48,
                     (Material *)in_stack_fffffffffffffe40,
                     SUB81((ulong)in_stack_fffffffffffffe38 >> 0x38,0));
          in_stack_fffffffffffffe38 = (btAlignedObjectArray<btSoftBody::Link> *)(in_RDI + 0x390);
          iVar4 = btAlignedObjectArray<btSoftBody::Link>::size
                            ((btAlignedObjectArray<btSoftBody::Link> *)(in_RDI + 0x390));
          pLVar9 = btAlignedObjectArray<btSoftBody::Link>::operator[]
                             (in_stack_fffffffffffffe38,iVar4 + -1);
          pLVar9->field_0x24 = pLVar9->field_0x24 & 0xfe | 1;
          local_c8 = local_c8 + 1;
          iVar4 = local_24;
        }
      }
    }
    if (local_38 != (void *)0x0) {
      operator_delete__(local_38);
    }
    local_4 = local_c8;
  }
  return local_4;
}

Assistant:

int				btSoftBody::generateBendingConstraints(int distance,Material* mat)
{
	int i,j;

	if(distance>1)
	{
		/* Build graph	*/ 
		const int		n=m_nodes.size();
		const unsigned	inf=(~(unsigned)0)>>1;
		unsigned*		adj=new unsigned[n*n];
		

#define IDX(_x_,_y_)	((_y_)*n+(_x_))
		for(j=0;j<n;++j)
		{
			for(i=0;i<n;++i)
			{
				if(i!=j)
				{
					adj[IDX(i,j)]=adj[IDX(j,i)]=inf;
				}
				else
				{
					adj[IDX(i,j)]=adj[IDX(j,i)]=0;
				}
			}
		}
		for( i=0;i<m_links.size();++i)
		{
			const int	ia=(int)(m_links[i].m_n[0]-&m_nodes[0]);
			const int	ib=(int)(m_links[i].m_n[1]-&m_nodes[0]);
			adj[IDX(ia,ib)]=1;
			adj[IDX(ib,ia)]=1;
		}


		//special optimized case for distance == 2
		if (distance == 2)
		{

			btAlignedObjectArray<NodeLinks> nodeLinks;


			/* Build node links */
			nodeLinks.resize(m_nodes.size());

			for( i=0;i<m_links.size();++i)
			{
				const int	ia=(int)(m_links[i].m_n[0]-&m_nodes[0]);
				const int	ib=(int)(m_links[i].m_n[1]-&m_nodes[0]);
				if (nodeLinks[ia].m_links.findLinearSearch(ib)==nodeLinks[ia].m_links.size())
					nodeLinks[ia].m_links.push_back(ib);

				if (nodeLinks[ib].m_links.findLinearSearch(ia)==nodeLinks[ib].m_links.size())
					nodeLinks[ib].m_links.push_back(ia);
			}
			for (int ii=0;ii<nodeLinks.size();ii++)
			{
				int i=ii;

				for (int jj=0;jj<nodeLinks[ii].m_links.size();jj++)
				{
					int k = nodeLinks[ii].m_links[jj];
					for (int kk=0;kk<nodeLinks[k].m_links.size();kk++)
					{
						int j = nodeLinks[k].m_links[kk];
						if (i!=j)
						{
							const unsigned	sum=adj[IDX(i,k)]+adj[IDX(k,j)];
							btAssert(sum==2);
							if(adj[IDX(i,j)]>sum)
							{
								adj[IDX(i,j)]=adj[IDX(j,i)]=sum;
							}
						}

					}
				}
			}
		} else
		{
			///generic Floyd's algorithm
			for(int k=0;k<n;++k)
			{
				for(j=0;j<n;++j)
				{
					for(i=j+1;i<n;++i)
					{
						const unsigned	sum=adj[IDX(i,k)]+adj[IDX(k,j)];
						if(adj[IDX(i,j)]>sum)
						{
							adj[IDX(i,j)]=adj[IDX(j,i)]=sum;
						}
					}
				}
			}
		}


		/* Build links	*/ 
		int	nlinks=0;
		for(j=0;j<n;++j)
		{
			for(i=j+1;i<n;++i)
			{
				if(adj[IDX(i,j)]==(unsigned)distance)
				{
					appendLink(i,j,mat);
					m_links[m_links.size()-1].m_bbending=1;
					++nlinks;
				}
			}
		}
		delete[] adj;		
		return(nlinks);
	}
	return(0);
}